

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# y4minput.c
# Opt level: O3

int file_read(void *buf,size_t size,FILE *file)

{
  uint uVar1;
  FILE *pFVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  uint *puVar6;
  char *pcVar7;
  ulong uVar8;
  uint uVar9;
  
  iVar3 = feof((FILE *)file);
  if (size == 0 || iVar3 != 0) {
    uVar9 = 0;
    uVar4 = 0;
    uVar8 = 0;
  }
  else {
    uVar8 = 0;
    uVar1 = 0;
    do {
      uVar9 = uVar1;
      sVar5 = fread((void *)((long)buf + uVar8),1,size - uVar8,(FILE *)file);
      uVar8 = sVar5 + uVar8;
      uVar4 = ferror((FILE *)file);
      if (uVar4 != 0) {
        puVar6 = (uint *)__errno_location();
        pFVar2 = _stderr;
        uVar1 = *puVar6;
        if ((uVar1 != 0xb) && (uVar1 != 4)) {
          pcVar7 = strerror(uVar1);
          fprintf(pFVar2,"Error reading file: %u of %u bytes read, %d: %s\n",uVar8 & 0xffffffff,
                  size & 0xffffffff,(ulong)uVar1,pcVar7);
          return 0;
        }
        clearerr((FILE *)file);
      }
      iVar3 = feof((FILE *)file);
    } while (((iVar3 == 0) && (uVar8 < size)) && (uVar1 = uVar9 + 1, uVar9 < 4));
    uVar9 = uVar9 + 1;
  }
  iVar3 = feof((FILE *)file);
  pFVar2 = _stderr;
  if ((iVar3 == 0) && (uVar8 != size)) {
    puVar6 = (uint *)__errno_location();
    uVar1 = *puVar6;
    pcVar7 = strerror(uVar1);
    fprintf(pFVar2,"Error reading file: %u of %u bytes read, error: %d, tries: %d, %d: %s\n",
            uVar8 & 0xffffffff,size & 0xffffffff,(ulong)uVar4,(ulong)uVar9,(ulong)uVar1,pcVar7);
  }
  return (uint)(uVar8 == size);
}

Assistant:

static int file_read(void *buf, size_t size, FILE *file) {
  const int kMaxTries = 5;
  int try_count = 0;
  int file_error = 0;
  size_t len = 0;
  while (!feof(file) && len < size && try_count < kMaxTries) {
    const size_t n = fread((uint8_t *)buf + len, 1, size - len, file);
    ++try_count;
    len += n;
    file_error = ferror(file);
    if (file_error) {
      if (errno == EINTR || errno == EAGAIN) {
        clearerr(file);
        continue;
      } else {
        fprintf(stderr, "Error reading file: %u of %u bytes read, %d: %s\n",
                (uint32_t)len, (uint32_t)size, errno, strerror(errno));
        return 0;
      }
    }
  }

  if (!feof(file) && len != size) {
    fprintf(stderr,
            "Error reading file: %u of %u bytes read,"
            " error: %d, tries: %d, %d: %s\n",
            (uint32_t)len, (uint32_t)size, file_error, try_count, errno,
            strerror(errno));
  }
  return len == size;
}